

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_interrupt(DisasContext *s,int intno,target_ulong cur_eip,target_ulong next_eip)

{
  TCGContext *tcg_ctx_00;
  TCGv_ptr arg1;
  TCGv_i32 arg2;
  TCGv_i32 arg3;
  TCGContext *tcg_ctx;
  target_ulong next_eip_local;
  target_ulong cur_eip_local;
  int intno_local;
  DisasContext *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  gen_update_cc_op(s);
  gen_jmp_im(s,cur_eip);
  arg1 = tcg_ctx_00->cpu_env;
  arg2 = tcg_const_i32_x86_64(tcg_ctx_00,intno);
  arg3 = tcg_const_i32_x86_64(tcg_ctx_00,(int)next_eip - (int)cur_eip);
  gen_helper_raise_interrupt_x86_64(tcg_ctx_00,arg1,arg2,arg3);
  (s->base).is_jmp = DISAS_NORETURN;
  return;
}

Assistant:

static void gen_interrupt(DisasContext *s, int intno,
                          target_ulong cur_eip, target_ulong next_eip)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    gen_update_cc_op(s);
    gen_jmp_im(s, cur_eip);
    gen_helper_raise_interrupt(tcg_ctx, tcg_ctx->cpu_env, tcg_const_i32(tcg_ctx, intno),
                               tcg_const_i32(tcg_ctx, next_eip - cur_eip));
    s->base.is_jmp = DISAS_NORETURN;
}